

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReaderCache::processMru(PtexReaderCache *this)

{
  size_t *psVar1;
  MruList *pMVar2;
  PtexCachedReader *pPVar3;
  size_t sVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int i;
  long lVar9;
  long lVar10;
  long lVar11;
  
  bVar5 = Mutex::trylock(&this->_mruLock);
  if (bVar5) {
    if (0x31 < this->_mruList->next) {
      pMVar2 = this->_mruList;
      this->_mruList = this->_prevMruList;
      this->_prevMruList = pMVar2;
      lVar8 = 0;
      lVar11 = 0;
      for (lVar9 = 0; lVar9 != 0x32; lVar9 = lVar9 + 1) {
        do {
          pPVar3 = pMVar2->files[lVar9];
        } while (pPVar3 == (PtexCachedReader *)0x0);
        pMVar2->files[lVar9] = (PtexCachedReader *)0x0;
        sVar4 = (pPVar3->super_PtexReader)._memUsed;
        lVar11 = (lVar11 + sVar4) - pPVar3->_memUsedAccountedFor;
        pPVar3->_memUsedAccountedFor = sVar4;
        sVar4 = (pPVar3->super_PtexReader)._opens;
        lVar10 = sVar4 - pPVar3->_opensAccountedFor;
        pPVar3->_opensAccountedFor = sVar4;
        sVar4 = (pPVar3->super_PtexReader)._blockReads;
        lVar6 = sVar4 - pPVar3->_blockReadsAccountedFor;
        pPVar3->_blockReadsAccountedFor = sVar4;
        if (lVar6 != 0 || lVar10 != 0) {
          this->_fileOpens = this->_fileOpens + lVar10;
          this->_blockReads = this->_blockReads + lVar6;
          PtexLruItem::push(&(this->_openFiles)._end,&pPVar3->_openFilesItem);
        }
        if (this->_maxMem != 0) {
          PtexLruItem::push(&(this->_activeFiles)._end,&pPVar3->_activeFilesItem);
        }
        lVar8 = lVar8 + lVar10;
      }
      pMVar2->next = 0;
      if (lVar11 != 0) {
        LOCK();
        psVar1 = &this->_memUsed;
        sVar4 = *psVar1;
        *psVar1 = *psVar1 + lVar11;
        UNLOCK();
        uVar7 = sVar4 + lVar11;
        if (sVar4 + lVar11 < this->_peakMemUsed) {
          uVar7 = this->_peakMemUsed;
        }
        this->_peakMemUsed = uVar7;
      }
      if (lVar8 != 0) {
        LOCK();
        psVar1 = &this->_filesOpen;
        sVar4 = *psVar1;
        *psVar1 = *psVar1 + lVar8;
        UNLOCK();
        uVar7 = sVar4 + lVar8;
        if (sVar4 + lVar8 < this->_peakFilesOpen) {
          uVar7 = this->_peakFilesOpen;
        }
        this->_peakFilesOpen = uVar7;
      }
      if (this->_maxMem == 0) {
        bVar5 = false;
      }
      else {
        bVar5 = this->_maxMem < this->_memUsed;
      }
      if (this->_maxFiles < this->_filesOpen) {
        pruneFiles(this);
      }
      if (bVar5) {
        pruneData(this);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mruLock);
    return;
  }
  return;
}

Assistant:

void PtexReaderCache::processMru()
{
    // use a non-blocking lock so we can proceed as soon as space has been freed in the mru list
    // (which happens almost immediately in the processMru thread that has the lock)
    if (!_mruLock.trylock()) return;
    if (_mruList->next < numMruFiles) {
        _mruLock.unlock();
        return;
    }

    // switch mru buffers and reset slot counter so other threads can proceed immediately
    MruList* mruList = _mruList;
    AtomicStore(&_mruList, _prevMruList);
    _prevMruList = mruList;

    // extract relevant stats and add to open/active list
    size_t memUsedChange = 0, filesOpenChange = 0;
    for (int i = 0; i < numMruFiles; ++i) {
        PtexCachedReader* reader;
        do { reader = mruList->files[i]; } while (!reader); // loop on (unlikely) race condition
        mruList->files[i] = 0;
        memUsedChange += reader->getMemUsedChange();
        size_t opens = reader->getOpensChange();
        size_t blockReads = reader->getBlockReadsChange();
        filesOpenChange += opens;
        if (opens || blockReads) {
            _fileOpens += opens;
            _blockReads += blockReads;
            _openFiles.push(reader);
        }
        if (_maxMem) {
            _activeFiles.push(reader);
        }
    }
    AtomicStore(&mruList->next, 0);
    adjustMemUsed(memUsedChange);
    adjustFilesOpen(filesOpenChange);

    bool shouldPruneFiles = _filesOpen > _maxFiles;
    bool shouldPruneData = _maxMem && _memUsed > _maxMem;

    if (shouldPruneFiles) {
        pruneFiles();
    }
    if (shouldPruneData) {
        pruneData();
    }
    _mruLock.unlock();
}